

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O0

int __thiscall MemoryMappedFile::open(MemoryMappedFile *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  MemoryMappedFile *extraout_RAX;
  char *pcVar4;
  int *piVar5;
  MemoryMappedFile *extraout_RAX_00;
  MemoryMappedFile *extraout_RAX_01;
  void *pvVar6;
  MemoryMappedFile *extraout_RAX_02;
  int in_ECX;
  size_t __len;
  Log local_258;
  String local_248;
  Log local_228;
  Log local_218;
  Log local_208;
  String local_1f8;
  Log local_1d8;
  Log local_1c8;
  undefined1 local_1b8 [8];
  stat st;
  Log local_118;
  Log local_108;
  Log local_f8;
  undefined1 local_e8 [24];
  Log errStream_1;
  undefined1 local_c0 [4];
  int lockRes;
  Log local_b0;
  Log local_a0;
  Log local_90;
  undefined1 local_80 [24];
  Log errStream;
  int protFlags;
  int openFlags;
  Log local_48;
  Log local_38;
  int local_28;
  AccessType local_24;
  LockType f_lock_local;
  AccessType f_access_local;
  Path *f_filename_local;
  MemoryMappedFile *this_local;
  
  local_28 = in_ECX;
  local_24 = __oflag;
  _f_lock_local = (String *)__file;
  f_filename_local = (Path *)this;
  bVar1 = isOpen(this);
  if (bVar1) {
    close(this,(int)__file);
  }
  if (local_24 == NO_ACCESS) {
    ::error();
    Log::operator<<(&local_38,(char *)&local_48);
    Log::~Log(&local_38);
    Log::~Log(&local_48);
    this_local._7_1_ = 0;
    this = extraout_RAX;
  }
  else {
    iVar2 = 2;
    if (local_24 == READ_ONLY) {
      iVar2 = 0;
    }
    errStream.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 3;
    if (local_24 == READ_ONLY) {
      errStream.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 1;
    }
    pcVar4 = String::nullTerminated(_f_lock_local);
    iVar2 = ::open(pcVar4,iVar2);
    this->mFd = iVar2;
    if (this->mFd == -1) {
      ::error();
      Log::operator<<((Log *)local_80,(char *)&local_90);
      ::operator<<((Log *)(local_80 + 0x10),(String *)local_80);
      Log::~Log((Log *)local_80);
      Log::~Log(&local_90);
      piVar5 = __errno_location();
      if (*piVar5 == 2) {
        Log::operator<<(&local_a0,local_80 + 0x10);
        Log::~Log(&local_a0);
      }
      else {
        Log::operator<<((Log *)local_c0,local_80 + 0x10);
        __errno_location();
        Log::operator<<(&local_b0,(int32_t)local_c0);
        Log::~Log(&local_b0);
        Log::~Log((Log *)local_c0);
      }
      this_local._7_1_ = 0;
      Log::~Log((Log *)(local_80 + 0x10));
      this = extraout_RAX_00;
    }
    else {
      if (local_28 == 0) {
        do {
          errStream_1.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._4_4_ = flock(this->mFd,6);
          bVar1 = false;
          if (errStream_1.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ == -1) {
            piVar5 = __errno_location();
            bVar1 = *piVar5 == 4;
          }
        } while (bVar1);
        if (errStream_1.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ == -1) {
          ::error();
          Log::operator<<((Log *)local_e8,(char *)&local_f8);
          ::operator<<((Log *)(local_e8 + 0x10),(String *)local_e8);
          Log::~Log((Log *)local_e8);
          Log::~Log(&local_f8);
          piVar5 = __errno_location();
          if (*piVar5 == 0xb) {
            pcVar4 = local_e8 + 0x10;
            Log::operator<<(&local_108,pcVar4);
            iVar2 = (int)pcVar4;
            Log::~Log(&local_108);
          }
          else {
            Log::operator<<((Log *)(st.__glibc_reserved + 2),local_e8 + 0x10);
            __errno_location();
            iVar2 = (int)&st + 0x88;
            Log::operator<<(&local_118,iVar2);
            Log::~Log(&local_118);
            Log::~Log((Log *)(st.__glibc_reserved + 2));
          }
          close(this,iVar2);
          this_local._7_1_ = 0;
          Log::~Log((Log *)(local_e8 + 0x10));
          this = extraout_RAX_01;
          goto LAB_0029e524;
        }
      }
      iVar2 = fstat(this->mFd,(stat *)local_1b8);
      if (iVar2 == 0) {
        this->mFileSize = st.st_rdev;
        if (this->mFileSize == 0) {
          Path::operator=(&this->mFilename,(Path *)_f_lock_local);
          this->mAccessType = local_24;
          this->mpMapped = (void *)0x0;
          this_local._7_1_ = 1;
        }
        else {
          __len = this->mFileSize;
          pvVar6 = mmap((void *)0x0,__len,
                        errStream.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._4_4_,1,this->mFd,0);
          this->mpMapped = pvVar6;
          if (this->mpMapped == (void *)0xffffffffffffffff) {
            this->mpMapped = (void *)0x0;
            close(this,(int)__len);
            ::error();
            Log::operator<<((Log *)&local_248,(char *)&local_258);
            ::operator<<((Log *)&local_248.mString.field_2,&local_248);
            Log::operator<<(&local_228,local_248.mString.field_2._M_local_buf);
            __errno_location();
            Log::operator<<(&local_218,(int32_t)&local_228);
            Log::~Log(&local_218);
            Log::~Log(&local_228);
            Log::~Log((Log *)&local_248.mString.field_2);
            Log::~Log((Log *)&local_248);
            Log::~Log(&local_258);
            this_local._7_1_ = 0;
            this = extraout_RAX_02;
          }
          else {
            Path::operator=(&this->mFilename,(Path *)_f_lock_local);
            this->mAccessType = local_24;
            this_local._7_1_ = 1;
          }
        }
      }
      else {
        ::error();
        Log::operator<<((Log *)&local_1f8,(char *)&local_208);
        ::operator<<((Log *)&local_1f8.mString.field_2,&local_1f8);
        Log::operator<<(&local_1d8,local_1f8.mString.field_2._M_local_buf);
        __errno_location();
        iVar2 = (int)&local_1d8;
        Log::operator<<(&local_1c8,iVar2);
        Log::~Log(&local_1c8);
        Log::~Log(&local_1d8);
        Log::~Log((Log *)&local_1f8.mString.field_2);
        Log::~Log((Log *)&local_1f8);
        Log::~Log(&local_208);
        uVar3 = close(this,iVar2);
        this = (MemoryMappedFile *)(ulong)uVar3;
        this_local._7_1_ = 0;
      }
    }
  }
LAB_0029e524:
  return (uint)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool MemoryMappedFile::open(const Path &f_filename, AccessType f_access,
                            LockType f_lock)
{
    if(isOpen()) close();

    if(f_access == NO_ACCESS)
    {
        error() << "Can't create MemoryMappedFile with access type NO_ACCESS";
        return false;
    }

#ifdef _WIN32

    const DWORD access = (f_access == READ_ONLY) ?
        GENERIC_READ : (GENERIC_READ | GENERIC_WRITE);
    const DWORD share = (f_lock == DO_LOCK) ?
        0 : (FILE_SHARE_READ | FILE_SHARE_WRITE);
    const DWORD protect = (f_access == READ_ONLY) ?
        PAGE_READONLY : PAGE_READWRITE;
    const DWORD desiredAccess = (f_access == READ_ONLY) ?
        FILE_MAP_READ : FILE_MAP_WRITE; // FILE_MAP_WRITE includes read access

    // first, we need to open the file:
    mhFile = CreateFileW(Utf8To16(f_filename.nullTerminated()),
                         access,
                         share,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);

    if(mhFile == INVALID_HANDLE_VALUE)
    {
        const DWORD errorCode = GetLastError();

        auto errStream = error() << "Can't open file " << f_filename;
        switch(errorCode)
        {
        case ERROR_FILE_NOT_FOUND:
            errStream << " (file not found)";
            break;
        case ERROR_SHARING_VIOLATION:
            errStream << " (file is locked)";
            break;
        default:
            errStream << "GetLastError(): " << errorCode;
        }

        return false;
    }

    mFileSize = GetFileSize(mhFile, NULL);

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can set up a file mapping:
    mhFileMapping = CreateFileMapping(mhFile,   // file to map
                                      NULL,     // security attrs
                                      protect,
                                      0, 0,     // use full file size
                                      NULL);    // name

    if(mhFileMapping == NULL)
    {
        error() << "Can't map file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

    // now we need to open a so-called "view" into the file mapping:
    mpMapped = MapViewOfFile(mhFileMapping, desiredAccess,
                             0,0,  // offset high and low
                             0);   // size


    if(mpMapped == NULL)
    {
        error() << "Can't map view of file " << f_filename << ". "
                << "GetLastError(): " << GetLastError();
        close();
        return false;
    }

#else
    // try to open the file
    const int openFlags = (f_access == READ_ONLY) ?
        O_RDONLY : O_RDWR;
    const int protFlags = (f_access == READ_ONLY) ?
        PROT_READ : (PROT_READ | PROT_WRITE);

    mFd = ::open(f_filename.nullTerminated(), openFlags);

    if(mFd == -1)
    {
        auto errStream = error() << "Could not open file " << f_filename;
        switch(errno)
        {
        case ENOENT:
            errStream << " (file does not exist)";
            break;
        default:
            errStream << ". errno=" << errno;
            break;
        }
        return false;
    }

    if(f_lock == DO_LOCK)
    {
        int lockRes;
        eintrwrap(lockRes, flock(mFd, LOCK_EX | LOCK_NB));

        if(lockRes == -1)
        {
            auto errStream = error() << "Could not lock file " << f_filename;
            switch(errno)
            {
            case EWOULDBLOCK:
                errStream << " (file is already locked)";
                break;
            default:
                errStream << ". errno=" << errno;
                break;
            }
            close();
            return false;
        }
    }

    // get file size
    struct stat st;
    if(fstat(mFd, &st) != 0)
    {
        error() << "Could not stat file " << f_filename
                << ". errno=" << errno;
        close();
        return false;
    }

    mFileSize = st.st_size;   // size in byte

    if(mFileSize == 0)
    {
        // can't map empty file. We still report it as success (with size() == 0)
        mFilename = f_filename;
        mAccessType = f_access;
        mpMapped = nullptr;
        return true;
    }

    // now, we can actually map the file
    mpMapped = mmap(
            NULL,       // destination hint
            mFileSize,
            protFlags,  // mmu page protection
            MAP_SHARED,
            mFd,
            0           // offset
        );

    if(mpMapped == MAP_FAILED)
    {
        mpMapped = nullptr;
        close();
        error() << "Could not map file " << f_filename
                << ". errno=" << errno;
        return false;
    }

#endif

    // everything worked out! We're done.
    mFilename = f_filename;
    mAccessType = f_access;
    return true;
}